

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXMLParser.cxx
# Opt level: O2

int testXMLParser(int param_1,char **param_2)

{
  int iVar1;
  ostream *poVar2;
  cmXMLParser parser;
  
  cmXMLParser::cmXMLParser(&parser);
  iVar1 = cmXMLParser::ParseFile
                    (&parser,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Tests/CMakeLib/testXMLParser.xml"
                    );
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"cmXMLParser failed!");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  cmXMLParser::~cmXMLParser(&parser);
  return (uint)(iVar1 == 0);
}

Assistant:

int testXMLParser(int, char*[])
{
  // TODO: Derive from parser and check attributes.
  cmXMLParser parser;
  if(!parser.ParseFile(SOURCE_DIR "/testXMLParser.xml"))
    {
    cmsys_ios::cerr << "cmXMLParser failed!" << cmsys_ios::endl;
    return 1;
    }
  return 0;
}